

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O2

int xar_bid(archive_read *a,int best_bid)

{
  uint32_t uVar1;
  void *pp;
  int iVar2;
  
  pp = __archive_read_ahead(a,0x1c,(ssize_t *)0x0);
  if (pp == (void *)0x0) {
    iVar2 = -1;
  }
  else {
    uVar1 = archive_be32dec(pp);
    iVar2 = 0;
    if (((uVar1 == 0x78617221) &&
        ((ushort)(*(ushort *)((long)pp + 4) << 8 | *(ushort *)((long)pp + 4) >> 8) == 0x1c)) &&
       (iVar2 = 0, (ushort)(*(ushort *)((long)pp + 6) << 8 | *(ushort *)((long)pp + 6) >> 8) == 1))
    {
      uVar1 = archive_be32dec((void *)((long)pp + 0x18));
      iVar2 = 0x60;
      if (2 < uVar1) {
        iVar2 = 0;
      }
    }
  }
  return iVar2;
}

Assistant:

static int
xar_bid(struct archive_read *a, int best_bid)
{
	const unsigned char *b;
	int bid;

	(void)best_bid; /* UNUSED */

	b = __archive_read_ahead(a, HEADER_SIZE, NULL);
	if (b == NULL)
		return (-1);

	bid = 0;
	/*
	 * Verify magic code
	 */
	if (archive_be32dec(b) != HEADER_MAGIC)
		return (0);
	bid += 32;
	/*
	 * Verify header size
	 */
	if (archive_be16dec(b+4) != HEADER_SIZE)
		return (0);
	bid += 16;
	/*
	 * Verify header version
	 */
	if (archive_be16dec(b+6) != HEADER_VERSION)
		return (0);
	bid += 16;
	/*
	 * Verify type of checksum
	 */
	switch (archive_be32dec(b+24)) {
	case CKSUM_NONE:
	case CKSUM_SHA1:
	case CKSUM_MD5:
		bid += 32;
		break;
	default:
		return (0);
	}

	return (bid);
}